

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O2

void do_modify_sniftab(uint value,uint mask,char cmd)

{
  long lVar1;
  snif *psVar2;
  long lVar3;
  
  lVar1 = (long)idx;
  psVar2 = sniftab;
  for (lVar3 = 0; lVar3 < lVar1; lVar3 = lVar3 + 1) {
    if ((((psVar2->current).can_id ^ value) & mask) == 0) {
      psVar2->flags = psVar2->flags & 0xfffffffeU | (uint)(cmd == '+');
    }
    psVar2 = psVar2 + 1;
  }
  return;
}

Assistant:

void do_modify_sniftab(unsigned int value, unsigned int mask, char cmd)
{
	int i;

	for (i = 0; i < idx ;i++) {
		if ((sniftab[i].current.can_id & mask) == (value & mask)) {
			if (cmd == '+')
				do_set(i, ENABLE);
			else
				do_clr(i, ENABLE);
		}
	}
}